

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_product_class_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int in_EAX;
  int iVar2;
  int iVar3;
  char *pcVar4;
  za_entry *entry;
  long lVar5;
  char *out_buffer;
  coda_product_class *pcVar6;
  int local_38 [2];
  
  local_38[0] = in_EAX;
  pcVar4 = get_mandatory_attribute_value(attr,"name",info->node->tag);
  if (pcVar4 == (char *)0x0) {
    return -1;
  }
  entry = coda_za_get_entry_by_name(info->zf,"VERSION");
  iVar2 = 0;
  if (entry != (za_entry *)0x0) {
    lVar5 = coda_za_get_entry_size(entry);
    if (lVar5 != 0) {
      out_buffer = (char *)malloc(lVar5 + 1U);
      if (out_buffer == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",lVar5 + 1U,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                       ,0xadb);
      }
      else {
        iVar2 = coda_za_read_entry(entry,out_buffer);
        if (iVar2 == 0) {
          out_buffer[lVar5] = '\0';
          lVar5 = coda_ascii_parse_int64(out_buffer,lVar5,(int64_t *)local_38,1);
          free(out_buffer);
          iVar2 = 0;
          if (-1 < lVar5) {
            iVar2 = local_38[0];
          }
          goto LAB_0012f505;
        }
        free(out_buffer);
      }
      return -1;
    }
    iVar2 = 0;
  }
LAB_0012f505:
  iVar3 = coda_data_dictionary_has_product_class(pcVar4);
  if (iVar3 != 0) {
    pcVar6 = coda_data_dictionary_get_product_class(pcVar4);
    if (pcVar6 == (coda_product_class *)0x0) {
      return -1;
    }
    iVar3 = coda_product_class_get_revision(pcVar6);
    if (iVar2 <= iVar3) {
      info->ignore_file = 1;
      coda_XML_StopParser(info->parser,'\0');
      info->abort_parser = 1;
      return 0;
    }
    iVar3 = coda_data_dictionary_remove_product_class(pcVar6);
    if (iVar3 != 0) {
      return -1;
    }
  }
  info->node->free_data = coda_product_class_delete;
  pcVar6 = coda_product_class_new(pcVar4);
  info->product_class = pcVar6;
  if (pcVar6 != (coda_product_class *)0x0) {
    pcVar4 = coda_za_get_filename(info->zf);
    iVar3 = coda_product_class_set_definition_file(pcVar6,pcVar4);
    pcVar6 = info->product_class;
    if (iVar3 == 0) {
      iVar2 = coda_product_class_set_revision(pcVar6,iVar2);
      pcVar6 = info->product_class;
      if (iVar2 == 0) {
        pnVar1 = info->node;
        pnVar1->data = pcVar6;
        pnVar1->init_sub_element[0xb] = string_data_init;
        pnVar1->add_element_to_parent[0xb] = cd_product_class_set_description;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0x20] = cd_product_type_init;
        pnVar1->add_element_to_parent[0x20] = cd_product_class_add_product_type;
        info->node->finalise_element = cd_product_class_finalise;
        return 0;
      }
    }
    coda_product_class_delete(pcVar6);
    info->product_class = (coda_product_class *)0x0;
  }
  return -1;
}

Assistant:

static int cd_product_class_init(parser_info *info, const char **attr)
{
    const char *name;
    int revision = 0;

    name = get_mandatory_attribute_value(attr, "name", info->node->tag);
    if (name == NULL)
    {
        return -1;
    }
    if (get_product_class_revision(info, &revision) != 0)
    {
        return -1;
    }
    /* see if there is already a version of this product class in the data dictionary */
    if (coda_data_dictionary_has_product_class(name))
    {
        coda_product_class *product_class;

        /* compare revision numbers */
        product_class = coda_data_dictionary_get_product_class(name);
        if (product_class == NULL)
        {
            return -1;
        }
        if (revision <= coda_product_class_get_revision(product_class))
        {
            /* the current available product class is as new or newer -> ignore this product class and stop parsing */
            info->ignore_file = 1;
            abort_parser(info);
            return 0;
        }
        /* the current available product class is older -> remove it */
        if (coda_data_dictionary_remove_product_class(product_class) != 0)
        {
            return -1;
        }
    }

    info->node->free_data = (free_data_handler)coda_product_class_delete;
    info->product_class = coda_product_class_new(name);
    if (info->product_class == NULL)
    {
        return -1;
    }
    if (coda_product_class_set_definition_file(info->product_class, za_get_filename(info->zf)) != 0)
    {
        coda_product_class_delete(info->product_class);
        info->product_class = NULL;
        return -1;
    }
    if (coda_product_class_set_revision(info->product_class, revision) != 0)
    {
        coda_product_class_delete(info->product_class);
        info->product_class = NULL;
        return -1;
    }
    info->node->data = info->product_class;

    register_sub_element(info->node, element_cd_description, string_data_init, cd_product_class_set_description);
    register_sub_element(info->node, element_cd_product_type, cd_product_type_init, cd_product_class_add_product_type);

    info->node->finalise_element = cd_product_class_finalise;

    return 0;
}